

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

StackSym * __thiscall
BackwardPass::ProcessByteCodeUsesDst(BackwardPass *this,ByteCodeUsesInstr *byteCodeUsesInstr)

{
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  Opnd *this_00;
  RegOpnd *this_01;
  StackSym *local_38;
  StackSym *dstStackSym;
  RegOpnd *dstRegOpnd;
  Opnd *dst;
  ByteCodeUsesInstr *byteCodeUsesInstr_local;
  BackwardPass *this_local;
  
  bVar2 = DoByteCodeUpwardExposedUsed(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x7cd,"(this->DoByteCodeUpwardExposedUsed())",
                       "this->DoByteCodeUpwardExposedUsed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = IR::Instr::GetDst(&byteCodeUsesInstr->super_Instr);
  if (this_00 != (Opnd *)0x0) {
    this_01 = IR::Opnd::AsRegOpnd(this_00);
    local_38 = Sym::AsStackSym(&this_01->m_sym->super_Sym);
    bVar2 = IR::Opnd::GetIsJITOptimizedReg(&this_01->super_Opnd);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x7d3,"(!dstRegOpnd->GetIsJITOptimizedReg())",
                         "!dstRegOpnd->GetIsJITOptimizedReg()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    RVar4 = StackSym::GetByteCodeRegSlot(local_38);
    if (RVar4 == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x7d4,"(dstStackSym->GetByteCodeRegSlot() != Js::Constants::NoRegister)",
                         "dstStackSym->GetByteCodeRegSlot() != Js::Constants::NoRegister");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    IVar3 = StackSym::GetType(local_38);
    if (IVar3 != TyVar) {
      local_38 = StackSym::GetVarEquivSym(local_38,(Func *)0x0);
    }
    if ((this->currentRegion == (Region *)0x0) ||
       (bVar2 = CheckWriteThroughSymInRegion(this,this->currentRegion,local_38), !bVar2)) {
      BVSparse<Memory::JitArenaAllocator>::Clear
                (this->currentBlock->byteCodeUpwardExposedUsed,(local_38->super_Sym).m_id);
      return local_38;
    }
  }
  return (StackSym *)0x0;
}

Assistant:

StackSym*
BackwardPass::ProcessByteCodeUsesDst(IR::ByteCodeUsesInstr * byteCodeUsesInstr)
{
    Assert(this->DoByteCodeUpwardExposedUsed());
    IR::Opnd * dst = byteCodeUsesInstr->GetDst();
    if (dst)
    {
        IR::RegOpnd * dstRegOpnd = dst->AsRegOpnd();
        StackSym * dstStackSym = dstRegOpnd->m_sym->AsStackSym();
        Assert(!dstRegOpnd->GetIsJITOptimizedReg());
        Assert(dstStackSym->GetByteCodeRegSlot() != Js::Constants::NoRegister);
        if (dstStackSym->GetType() != TyVar)
        {
            dstStackSym = dstStackSym->GetVarEquivSym(nullptr);
        }

        // If the current region is a Try, symbols in its write-through set shouldn't be cleared.
        // Otherwise, symbols in the write-through set of the first try ancestor shouldn't be cleared.
        if (!this->currentRegion ||
            !this->CheckWriteThroughSymInRegion(this->currentRegion, dstStackSym))
        {
            this->currentBlock->byteCodeUpwardExposedUsed->Clear(dstStackSym->m_id);
            return dstStackSym;

        }
    }
    return nullptr;
}